

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O2

Matrix4d *
opengv::relative_pose::modules::ge::composeGwithJacobians
          (Matrix4d *__return_storage_ptr__,Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,
          Matrix3d *yzF,Matrix3d *zxF,Matrix<double,_3,_9,_0,_3,_9> *x1P,
          Matrix<double,_3,_9,_0,_3,_9> *y1P,Matrix<double,_3,_9,_0,_3,_9> *z1P,
          Matrix<double,_3,_9,_0,_3,_9> *x2P,Matrix<double,_3,_9,_0,_3,_9> *y2P,
          Matrix<double,_3,_9,_0,_3,_9> *z2P,Matrix<double,_9,_9,_0,_9,_9> *m11P,
          Matrix<double,_9,_9,_0,_9,_9> *m12P,Matrix<double,_9,_9,_0,_9,_9> *m22P,cayley_t *cayley,
          Matrix4d *G_jac1,Matrix4d *G_jac2,Matrix4d *G_jac3)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  Matrix3d *pMVar6;
  Scalar SVar7;
  Scalar SVar8;
  Scalar SVar9;
  Scalar SVar10;
  Scalar SVar11;
  Scalar SVar12;
  Scalar SVar13;
  Scalar SVar14;
  Scalar SVar15;
  Scalar SVar16;
  Scalar SVar17;
  Scalar SVar18;
  rotation_t R;
  Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> local_420;
  Matrix<double,_3,_9,_0,_3,_9> *local_3f0;
  double *pdStack_3e8;
  double *local_3e0;
  rotation_t *local_3d8;
  Matrix<double,_3,_9,_0,_3,_9> *local_3d0;
  double *pdStack_3c8;
  undefined8 local_3c0;
  rotation_t *local_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  Matrix4d *local_398;
  Matrix3d *local_390;
  Matrix3d *local_388;
  rotation_t R_jac2;
  rotation_t R_jac1;
  rotation_t R_jac3;
  Matrix<double,_9,_1,_0,_9,_1> Cols;
  Matrix<double,_1,_9,_1,_1,_9> Rows;
  Matrix<double,_9,_1,_0,_9,_1> Cols_jac2;
  Matrix<double,_9,_1,_0,_9,_1> Cols_jac1;
  Matrix<double,_9,_1,_0,_9,_1> Cols_jac3;
  Matrix<double,_1,_9,_1,_1,_9> Rows_jac3;
  Matrix<double,_1,_9,_1,_1,_9> Rows_jac2;
  Matrix<double,_1,_9,_1,_1,_9> Rows_jac1;
  Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false> local_60;
  
  local_398 = __return_storage_ptr__;
  local_390 = xxF;
  math::cayley2rot_reduced(cayley);
  dVar4 = (cayley->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[0];
  dVar5 = (cayley->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[1];
  dVar3 = (cayley->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[2];
  R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       dVar4 + dVar4;
  R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       dVar5 + dVar5;
  R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       dVar4 * -2.0;
  R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       dVar3 * 2.0;
  R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       dVar5 * -2.0;
  R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       dVar3 * -2.0;
  R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       -2.0;
  R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       2.0;
  R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       2.0;
  R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       -2.0;
  R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       (double)vmovlpd_avx((undefined1  [16])
                           R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array._56_16_);
  R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._0_16_
       = vshufpd_avx((undefined1  [16])
                     R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                     m_data.array._56_16_,
                     (undefined1  [16])
                     R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                     m_data.array._24_16_,1);
  R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       (double)vmovlpd_avx((undefined1  [16])
                           R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array._56_16_);
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2
  ;
  R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       -2.0;
  R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       2.0;
  R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._56_16_
       = vshufpd_avx((undefined1  [16])
                     R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                     m_data.array._24_16_,
                     (undefined1  [16])
                     R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                     m_data.array._56_16_,1);
  R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._40_16_
       = vshufpd_avx((undefined1  [16])
                     R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                     m_data.array._24_16_,
                     (undefined1  [16])
                     R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                     m_data.array._24_16_,1);
  R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       (double)vmovlpd_avx((undefined1  [16])
                           R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array._24_16_);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)yyF;
  pdStack_3e8 = pdVar1;
  local_3d8 = &R;
  local_388 = yyF;
  R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._0_16_
       = R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array.
         _24_16_;
  R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7]
  ;
  R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4]
  ;
  R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4]
  ;
  R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
  ;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  pdVar2 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3b0 = 1;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)yzF;
  pdStack_3c8 = pdVar2;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)zzF;
  pdStack_3e8 = pdVar2;
  local_3d8 = &R;
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  pdVar1 = R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0x4000000000000000;
  pdStack_3c8 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  (local_398->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0] = SVar9 + SVar8 + SVar7;
  local_3b0 = 2;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)pdVar1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)yyF;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac1;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       SVar8;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3c8 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3b0 = 1;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)pdVar1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)yzF;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)(R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       SVar8 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[0];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  pdVar1 = R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 1;
  local_3b0 = 1;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)yzF;
  pdStack_3c8 = pdVar1;
  local_3b8 = &R_jac1;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       SVar8 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[0];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0x4000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  pdStack_3c8 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1;
  local_3b0 = 1;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)zzF;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  pdVar1 = R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 2;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       SVar8 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[0];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0x4000000000000000;
  pdStack_3c8 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)local_388;
  local_3b0 = 2;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)pdVar1;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       SVar8;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac2;
  pdStack_3c8 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3b0 = 1;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)pdVar1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)yzF;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)(R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2);
  local_3b8 = &R_jac2;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       SVar8 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[0];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  pdVar1 = R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 1;
  local_3b0 = 1;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)yzF;
  pdStack_3c8 = pdVar1;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac2;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       SVar8 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[0];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0x4000000000000000;
  pdStack_3c8 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3b0 = 1;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)pdVar1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)zzF;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  pdVar1 = R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac3;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       SVar8 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[0];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0x4000000000000000;
  pdStack_3c8 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)local_388;
  local_3b0 = 2;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)pdVar1;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac3;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       SVar8;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3c8 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3b0 = 1;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)pdVar1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)yzF;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)(R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       SVar8 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[0];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  pdVar1 = R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 1;
  local_3b0 = 1;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)yzF;
  pdStack_3c8 = pdVar1;
  local_3b8 = &R_jac3;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       SVar8 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[0];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0x4000000000000000;
  pdStack_3c8 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3b0 = 1;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac3;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)zzF;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2
  ;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       SVar8 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[0];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)yzF;
  pdStack_3e8 = (double *)&R;
  local_3d8 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3b0 = 2;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)xyF;
  pdStack_3c8 = pdVar1;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  pdVar2 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3b0 = 0;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)pdVar2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)zzF;
  pdStack_3c8 = (double *)&R;
  local_3b8 = &R;
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)zxF;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  pdStack_3e8 = pdVar1;
  local_3d8 = &R;
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  (local_398->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [4] = SVar9 + SVar10 + SVar8 + SVar7;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)yzF;
  pdStack_3e8 = (double *)&R;
  local_3d8 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       SVar7;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)yzF;
  pdStack_3e8 = (double *)&R_jac1;
  local_3d8 = &R_jac1;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)(R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 2);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       SVar7 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[4];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  pdStack_3c8 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3b0 = 2;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)xyF;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  pdVar1 = R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 1;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       SVar8 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[4];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 0;
  local_3b8 = (rotation_t *)0x1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac1;
  pdStack_3e8 = (double *)zzF;
  local_3e0 = (double *)&R;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)&R;
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       SVar11 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                m_data.array[4];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 0;
  local_3b8 = (rotation_t *)0x1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  pdStack_3e8 = (double *)zzF;
  local_3e0 = (double *)&R_jac1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)&R_jac1;
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  pdStack_3e8 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       SVar11 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                m_data.array[4];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)zxF;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac1;
  local_3d8 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1;
  pdStack_3e8 = R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 2;
  local_3d8 = &R_jac1;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       SVar7 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[4];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)zxF;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac2;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       SVar7 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[4];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)yzF;
  pdStack_3e8 = (double *)&R;
  local_3d8 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2
  ;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       SVar7;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)yzF;
  pdStack_3e8 = (double *)&R_jac2;
  local_3d8 = &R_jac2;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       SVar7 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[4];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)(R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 2);
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3b0 = 2;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac2;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)xyF;
  pdStack_3c8 = pdVar1;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  pdVar1 = R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac2;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       SVar8 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[4];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 0;
  local_3b8 = (rotation_t *)0x1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar1;
  pdStack_3e8 = (double *)zzF;
  local_3e0 = (double *)&R;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)&R;
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       SVar11 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                m_data.array[4];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 0;
  local_3b8 = (rotation_t *)0x1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  pdStack_3e8 = (double *)zzF;
  local_3e0 = (double *)&R_jac2;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)&R_jac2;
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  pdStack_3e8 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       SVar11 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                m_data.array[4];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)zxF;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac2;
  local_3d8 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  pdStack_3e8 = R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 2;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       SVar7 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[4];
  local_3d8 = &R_jac2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)zxF;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       2;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       SVar7 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[4];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac3;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)yzF;
  pdStack_3e8 = (double *)&R;
  local_3d8 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2
  ;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       SVar7;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)yzF;
  pdStack_3e8 = (double *)&R_jac3;
  local_3d8 = &R_jac3;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       SVar7 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[4];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)(R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 2);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3b0 = 2;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac3;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)xyF;
  pdStack_3c8 = pdVar1;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  pdVar1 = R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 1;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       SVar8 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[4];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 0;
  local_3b8 = (rotation_t *)0x1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac3;
  pdStack_3e8 = (double *)zzF;
  local_3e0 = (double *)&R;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)&R;
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       SVar11 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                m_data.array[4];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 0;
  local_3b8 = (rotation_t *)0x1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  pdStack_3e8 = (double *)zzF;
  local_3e0 = (double *)&R_jac3;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)&R_jac3;
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  pdStack_3e8 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       SVar11 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                m_data.array[4];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)zxF;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac3;
  local_3d8 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  pdStack_3e8 = R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 2;
  local_3d8 = &R_jac3;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       SVar7 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[4];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)zxF;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  pdVar2 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2
  ;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       SVar7 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[4];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)xyF;
  pdStack_3e8 = pdVar1;
  local_3d8 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)local_388;
  local_3b0 = 0;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)pdVar2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  pdStack_3c8 = (double *)&R;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)zxF;
  local_3b0 = 1;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  pdStack_3c8 = pdVar1;
  local_3b8 = &R;
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)yzF;
  pdStack_3e8 = (double *)&R;
  local_3d8 = &R;
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac1;
  (local_398->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [8] = SVar9 + SVar10 + SVar8 + SVar7;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)xyF;
  pdStack_3e8 = pdVar1;
  local_3d8 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       SVar7;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  pdStack_3e8 = R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)xyF;
  local_3d8 = &R_jac1;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  pMVar6 = local_388;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       2;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       SVar7 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[8];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  pdStack_3e8 = (double *)local_388;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 0;
  local_3b8 = (rotation_t *)0x1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac1;
  local_3e0 = (double *)&R;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)&R;
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       SVar11 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                m_data.array[8];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  pdStack_3e8 = (double *)pMVar6;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 0;
  local_3b8 = (rotation_t *)0x1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  local_3e0 = (double *)&R_jac1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)&R_jac1;
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  pdVar1 = R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 1;
  pdStack_3c8 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       SVar11 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                m_data.array[8];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)zxF;
  local_3b0 = 1;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac1;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       SVar8 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[8];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)yzF;
  pdStack_3e8 = (double *)&R;
  local_3d8 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       SVar7 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[8];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)yzF;
  pdStack_3e8 = (double *)&R_jac1;
  local_3d8 = &R_jac1;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac2;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       SVar7 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[8];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)xyF;
  pdStack_3e8 = pdVar1;
  local_3d8 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       SVar7;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  pdStack_3e8 = R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)xyF;
  local_3d8 = &R_jac2;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  pMVar6 = local_388;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       2;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       SVar7 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[8];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  pdStack_3e8 = (double *)local_388;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 0;
  local_3b8 = (rotation_t *)0x1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac2;
  local_3e0 = (double *)&R;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)&R;
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       SVar11 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                m_data.array[8];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  pdStack_3e8 = (double *)pMVar6;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 0;
  local_3b8 = (rotation_t *)0x1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  local_3e0 = (double *)&R_jac2;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)&R_jac2;
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)(R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 1);
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       SVar11 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                m_data.array[8];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)zxF;
  local_3b0 = 1;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac2;
  pdStack_3c8 = pdVar1;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       1;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       SVar8 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[8];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac2;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)yzF;
  pdStack_3e8 = (double *)&R;
  local_3d8 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  pdStack_3e8 = (double *)&R_jac2;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       SVar7 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[8];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)yzF;
  local_3d8 = (rotation_t *)pdStack_3e8;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac3;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       SVar7 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[8];
  pdStack_3e8 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)xyF;
  local_3d8 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       SVar7;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  pdStack_3e8 = R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)xyF;
  local_3d8 = &R_jac3;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  pMVar6 = local_388;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       2;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       SVar7 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[8];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  pdStack_3e8 = (double *)local_388;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 0;
  local_3b8 = (rotation_t *)0x1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac3;
  local_3e0 = (double *)&R;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)&R;
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       SVar11 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                m_data.array[8];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  pdStack_3e8 = (double *)pMVar6;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 0;
  local_3b8 = (rotation_t *)0x1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  local_3e0 = (double *)&R_jac3;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)&R_jac3;
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  pdVar1 = R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 1;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       SVar11 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                m_data.array[8];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)zxF;
  pdStack_3c8 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1;
  local_3b0 = 1;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac3;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       SVar8 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[8];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac3;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)yzF;
  pdStack_3e8 = (double *)&R;
  local_3d8 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       SVar7 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[8];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  pdStack_3e8 = (double *)&R_jac3;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)yzF;
  local_3d8 = (rotation_t *)pdStack_3e8;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       SVar7 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[8];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)zzF;
  pdStack_3e8 = (double *)&R;
  local_3d8 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2
  ;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)zxF;
  local_3b0 = 2;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  pdStack_3c8 = pdVar1;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)local_390;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  pdStack_3e8 = pdVar1;
  local_3d8 = &R;
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R_jac1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0x4000000000000000;
  (local_398->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [5] = SVar9 + SVar8 + SVar7;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3b0 = 0;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.
       m_value;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)zzF;
  pdStack_3c8 = (double *)&R;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R_jac1;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       SVar8;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)zxF;
  local_3b0 = 2;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.
       m_value;
  pdStack_3c8 = pdVar1;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       SVar8 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[5];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)zxF;
  pdVar1 = R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 2;
  local_3b0 = 2;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  pdStack_3c8 = pdVar1;
  local_3b8 = &R_jac1;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       SVar8 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[5];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0x4000000000000000;
  pdStack_3c8 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)local_390;
  local_3b0 = 2;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac1;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       SVar8 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[5];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0x4000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3b0 = 0;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R_jac2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac2;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)zzF;
  pdStack_3c8 = (double *)&R;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       SVar8;
  pdStack_3c8 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)zxF;
  local_3b0 = 2;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R_jac2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac2;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_3b8 = &R_jac2;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       SVar8 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[5];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  pdVar1 = R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 2;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)zxF;
  local_3b0 = 2;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  pdStack_3c8 = pdVar1;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac2;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       SVar8 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[5];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0x4000000000000000;
  pdStack_3c8 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)local_390;
  local_3b0 = 2;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)pdVar1;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       SVar8 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[5];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0x4000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3b0 = 0;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R_jac3;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac3;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)zzF;
  pdStack_3c8 = (double *)&R;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       SVar8;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  pdStack_3c8 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)zxF;
  local_3b0 = 2;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R_jac3;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac3;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_3b8 = &R_jac3;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       SVar8 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[5];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  pdVar1 = R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 2;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)zxF;
  local_3b0 = 2;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  pdStack_3c8 = pdVar1;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac3;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       SVar8 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[5];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0x4000000000000000;
  pdStack_3c8 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)local_390;
  local_3b0 = 2;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)pdVar1;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       SVar8 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[5];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)zxF;
  pdStack_3e8 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  local_3d8 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3b0 = 0;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)yzF;
  pdStack_3c8 = (double *)&R;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2
  ;
  pdStack_3c8 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)local_390;
  local_3b0 = 1;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  local_3b8 = &R;
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)xyF;
  pdStack_3e8 = (double *)&R;
  local_3d8 = &R;
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R_jac1;
  pdStack_3e8 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1;
  (local_398->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [9] = SVar9 + SVar10 + SVar8 + SVar7;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)zxF;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)
       local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data;
  local_3d8 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  pdStack_3e8 = R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 1;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       SVar7;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)zxF;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  local_3d8 = &R_jac1;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       SVar7 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[9];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3b0 = 0;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R_jac1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)yzF;
  pdStack_3c8 = (double *)&R;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  pMVar6 = local_390;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       2;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       SVar8 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[9];
  local_3e0 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
              + 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  pdStack_3e8 = (double *)local_390;
  pdStack_3c8 = (double *)0x1;
  local_3c0 = 0;
  local_3b8 = (rotation_t *)0x1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)&R;
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       SVar11 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                m_data.array[9];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  pdStack_3e8 = (double *)pMVar6;
  local_3e0 = R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
              array + 1;
  pdStack_3c8 = (double *)0x1;
  local_3c0 = 0;
  local_3b8 = (rotation_t *)0x1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)&R_jac1;
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       2;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       SVar11 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                m_data.array[9];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)xyF;
  pdStack_3e8 = (double *)&R;
  local_3d8 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       SVar7 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[9];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  pdStack_3e8 = (double *)&R_jac1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)xyF;
  local_3d8 = (rotation_t *)pdStack_3e8;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  pdStack_3e8 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       SVar7 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[9];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)zxF;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R_jac2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac2;
  local_3d8 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  pdStack_3e8 = R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 1;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       SVar7;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)zxF;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  local_3d8 = &R_jac2;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       SVar7 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[9];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3b0 = 0;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R_jac2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac2;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)yzF;
  pdStack_3c8 = (double *)&R;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  pMVar6 = local_390;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       2;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       SVar8 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[9];
  local_3e0 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
              + 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  pdStack_3e8 = (double *)local_390;
  pdStack_3c8 = (double *)0x1;
  local_3c0 = 0;
  local_3b8 = (rotation_t *)0x1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac2;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)&R;
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       SVar11 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                m_data.array[9];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  pdStack_3e8 = (double *)pMVar6;
  local_3e0 = R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
              array + 1;
  pdStack_3c8 = (double *)0x1;
  local_3c0 = 0;
  local_3b8 = (rotation_t *)0x1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)&R_jac2;
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       2;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       SVar11 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                m_data.array[9];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac2;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)xyF;
  pdStack_3e8 = (double *)&R;
  local_3d8 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       SVar7 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[9];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  pdStack_3e8 = (double *)&R_jac2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)xyF;
  local_3d8 = (rotation_t *)pdStack_3e8;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R_jac3;
  pdStack_3e8 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       SVar7 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[9];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)zxF;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)
       local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data;
  local_3d8 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  pdStack_3e8 = R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 1;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       SVar7;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)zxF;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  local_3d8 = &R_jac3;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       SVar7 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[9];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3b0 = 0;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R_jac3;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac3;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)yzF;
  pdStack_3c8 = (double *)&R;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  pMVar6 = local_390;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       2;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       SVar8 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[9];
  local_3e0 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
              + 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  pdStack_3e8 = (double *)local_390;
  pdStack_3c8 = (double *)0x1;
  local_3c0 = 0;
  local_3b8 = (rotation_t *)0x1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac3;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)&R;
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       SVar11 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                m_data.array[9];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  pdStack_3e8 = (double *)pMVar6;
  local_3e0 = R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
              array + 1;
  pdStack_3c8 = (double *)0x1;
  local_3c0 = 0;
  local_3b8 = (rotation_t *)0x1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)&R_jac3;
  SVar11 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       2;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       SVar11 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                m_data.array[9];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac3;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)xyF;
  pdStack_3e8 = (double *)&R;
  local_3d8 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       SVar7 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[9];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  pdStack_3e8 = (double *)&R_jac3;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)xyF;
  local_3d8 = (rotation_t *)pdStack_3e8;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  pMVar6 = local_390;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       SVar7 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[9];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)local_390;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  pdStack_3e8 = local_420.
                super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
                super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
                super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
                super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.
                m_data;
  local_3d8 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  local_3b0 = 1;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)xyF;
  pdStack_3c8 = pdVar1;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)local_388;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3c8 = (double *)0x0;
  local_3c0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  pdStack_3e8 = (double *)&R;
  local_3d8 = &R;
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)(R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 1);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0x4000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)pMVar6;
  local_3b0 = 1;
  uStack_3a8 = 0;
  local_3a0 = 1;
  (local_398->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [10] = SVar9 + SVar8 + SVar7;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac1;
  pdStack_3c8 = pdVar1;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = SVar8;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3b0 = 1;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R_jac1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)xyF;
  pdStack_3c8 = pdVar1;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  pdStack_3c8 = R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 1;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = SVar8 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                 m_data.array[10];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3b0 = 1;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)xyF;
  local_3b8 = &R_jac1;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = SVar8 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                 m_data.array[10];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0x4000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)local_388;
  local_3b0 = 0;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R_jac1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac1;
  pdStack_3c8 = (double *)&R;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)(R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 1);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = SVar8 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                 m_data.array[10];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0x4000000000000000;
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)local_390;
  local_3b0 = 1;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac2;
  pdStack_3c8 = pdVar1;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = SVar8;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3b0 = 1;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R_jac2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac2;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)xyF;
  pdStack_3c8 = pdVar1;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  pdStack_3c8 = R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 1;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = SVar8 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                 m_data.array[10];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3b0 = 1;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)xyF;
  local_3b8 = &R_jac2;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = SVar8 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                 m_data.array[10];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0x4000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)local_388;
  local_3b0 = 0;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R_jac2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac2;
  pdStack_3c8 = (double *)&R;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)(R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 1);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = SVar8 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                 m_data.array[10];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0x4000000000000000;
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)local_390;
  local_3b0 = 1;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac3;
  pdStack_3c8 = pdVar1;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = SVar8;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3b0 = 1;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R_jac3;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac3;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)xyF;
  pdStack_3c8 = pdVar1;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  pdStack_3c8 = R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 1;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = SVar8 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                 m_data.array[10];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3b0 = 1;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)xyF;
  local_3b8 = &R_jac3;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = SVar8 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                 m_data.array[10];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0x4000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = (Matrix<double,_3,_9,_0,_3,_9> *)local_388;
  local_3b0 = 0;
  uStack_3a8 = 0;
  local_3a0 = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R_jac3;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac3;
  pdStack_3c8 = (double *)&R;
  local_3b8 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_420);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = SVar8 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                 m_data.array[10];
  dVar3 = (local_398->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
          .array[8];
  (local_398->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [1] = (local_398->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
        array[4];
  (local_398->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [2] = dVar3;
  (local_398->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [6] = (local_398->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
        array[9];
  dVar3 = (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[8];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[1] =
       (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [4];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[2] =
       dVar3;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[6] =
       (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [9];
  dVar3 = (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[8];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[1] =
       (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [4];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[2] =
       dVar3;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[6] =
       (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [9];
  dVar3 = (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[8];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[1] =
       (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [4];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[2] =
       dVar3;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[6] =
       (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [9];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  Cols.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[4] = 0.0;
  Cols.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[5] =
       4.44659081257122e-323;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  Cols.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[0] =
       (double)&Rows;
  Cols.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[2] =
       (double)&Rows;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,9,1,1,9>,1,3,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>
            ((Block<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1,_3,_false> *)&Cols,&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  Cols.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[0] =
       (double)(Rows.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.
                array + 3);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  Cols.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[4] =
       1.48219693752374e-323;
  Cols.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[5] =
       4.44659081257122e-323;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  Cols.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[2] =
       (double)&Rows;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,9,1,1,9>,1,3,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>
            ((Block<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1,_3,_false> *)&Cols,&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  Cols.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[0] =
       (double)(Rows.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.
                array + 6);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  Cols.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[4] =
       2.96439387504748e-323;
  Cols.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[5] =
       4.44659081257122e-323;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  Cols.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[2] =
       (double)&Rows;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,9,1,1,9>,1,3,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>
            ((Block<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1,_3,_false> *)&Cols,&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 3;
  Rows_jac1.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[3] =
       0.0;
  Rows_jac1.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[5] =
       4.44659081257122e-323;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  Rows_jac1.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[0] =
       (double)&Cols;
  Rows_jac1.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[2] =
       (double)&Cols;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,1,0,9,1>,3,1,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
            ((Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false> *)&Rows_jac1,
             (Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 3;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 1;
  Rows_jac1.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[0] =
       (double)(Cols.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
                array + 3);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 3;
  Rows_jac1.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[3] =
       1.48219693752374e-323;
  Rows_jac1.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[5] =
       4.44659081257122e-323;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  Rows_jac1.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[2] =
       (double)&Cols;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,1,0,9,1>,3,1,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
            ((Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false> *)&Rows_jac1,
             (Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 6;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  Rows_jac1.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[0] =
       (double)(Cols.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
                array + 6);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 3;
  Rows_jac1.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[3] =
       2.96439387504748e-323;
  Rows_jac1.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[5] =
       4.44659081257122e-323;
  Rows_jac1.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[2] =
       (double)&Cols;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,1,0,9,1>,3,1,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
            ((Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false> *)&Rows_jac1,
             (Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  Rows_jac2.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[4] =
       0.0;
  Rows_jac2.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[5] =
       4.44659081257122e-323;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R_jac1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac1;
  Rows_jac2.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[0] =
       (double)&Rows_jac1;
  Rows_jac2.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[2] =
       (double)&Rows_jac1;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,9,1,1,9>,1,3,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>
            ((Block<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1,_3,_false> *)&Rows_jac2,&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  Rows_jac2.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[0] =
       (double)(Rows_jac1.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.
                m_data.array + 3);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  Rows_jac2.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[4] =
       1.48219693752374e-323;
  Rows_jac2.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[5] =
       4.44659081257122e-323;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac1;
  Rows_jac2.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[2] =
       (double)&Rows_jac1;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,9,1,1,9>,1,3,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>
            ((Block<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1,_3,_false> *)&Rows_jac2,&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  Rows_jac2.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[0] =
       (double)(Rows_jac1.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.
                m_data.array + 6);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  Rows_jac2.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[4] =
       2.96439387504748e-323;
  Rows_jac2.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[5] =
       4.44659081257122e-323;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac1;
  Rows_jac2.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[2] =
       (double)&Rows_jac1;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,9,1,1,9>,1,3,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>
            ((Block<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1,_3,_false> *)&Rows_jac2,&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  Rows_jac3.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[4] =
       0.0;
  Rows_jac3.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[5] =
       4.44659081257122e-323;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R_jac2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac2;
  Rows_jac3.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[0] =
       (double)&Rows_jac2;
  Rows_jac3.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[2] =
       (double)&Rows_jac2;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,9,1,1,9>,1,3,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>
            ((Block<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1,_3,_false> *)&Rows_jac3,&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  Rows_jac3.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[0] =
       (double)(Rows_jac2.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.
                m_data.array + 3);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  Rows_jac3.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[4] =
       1.48219693752374e-323;
  Rows_jac3.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[5] =
       4.44659081257122e-323;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac2;
  Rows_jac3.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[2] =
       (double)&Rows_jac2;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,9,1,1,9>,1,3,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>
            ((Block<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1,_3,_false> *)&Rows_jac3,&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  Rows_jac3.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[0] =
       (double)(Rows_jac2.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.
                m_data.array + 6);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  Rows_jac3.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[4] =
       2.96439387504748e-323;
  Rows_jac3.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[5] =
       4.44659081257122e-323;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac2;
  Rows_jac3.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[2] =
       (double)&Rows_jac2;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,9,1,1,9>,1,3,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>
            ((Block<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1,_3,_false> *)&Rows_jac3,&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  Cols_jac1.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[4] =
       0.0;
  Cols_jac1.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[5] =
       4.44659081257122e-323;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R_jac3;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac3;
  Cols_jac1.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[0] =
       (double)&Rows_jac3;
  Cols_jac1.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[2] =
       (double)&Rows_jac3;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,9,1,1,9>,1,3,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>
            ((Block<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1,_3,_false> *)&Cols_jac1,&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  Cols_jac1.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[0] =
       (double)(Rows_jac3.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.
                m_data.array + 3);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  Cols_jac1.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[4] =
       1.48219693752374e-323;
  Cols_jac1.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[5] =
       4.44659081257122e-323;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac3;
  Cols_jac1.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[2] =
       (double)&Rows_jac3;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,9,1,1,9>,1,3,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>
            ((Block<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1,_3,_false> *)&Cols_jac1,&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  Cols_jac1.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[0] =
       (double)(Rows_jac3.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.
                m_data.array + 6);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  Cols_jac1.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[4] =
       2.96439387504748e-323;
  Cols_jac1.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[5] =
       4.44659081257122e-323;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac3;
  Cols_jac1.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[2] =
       (double)&Rows_jac3;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,1,9,1,1,9>,1,3,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>
            ((Block<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1,_3,_false> *)&Cols_jac1,&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 3;
  Cols_jac2.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[3] =
       0.0;
  Cols_jac2.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[5] =
       4.44659081257122e-323;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R_jac1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac1;
  Cols_jac2.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[0] =
       (double)&Cols_jac1;
  Cols_jac2.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[2] =
       (double)&Cols_jac1;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,1,0,9,1>,3,1,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
            ((Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false> *)&Cols_jac2,
             (Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       3;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  Cols_jac2.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[0] =
       (double)(Cols_jac1.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                m_data.array + 3);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 3;
  Cols_jac2.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[3] =
       1.48219693752374e-323;
  Cols_jac2.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[5] =
       4.44659081257122e-323;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac1;
  Cols_jac2.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[2] =
       (double)&Cols_jac1;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,1,0,9,1>,3,1,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
            ((Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false> *)&Cols_jac2,
             (Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       6;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  Cols_jac2.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[0] =
       (double)(Cols_jac1.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                m_data.array + 6);
  Cols_jac2.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[2] =
       (double)&Cols_jac1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 3;
  Cols_jac2.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[3] =
       2.96439387504748e-323;
  Cols_jac2.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[5] =
       4.44659081257122e-323;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac1;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,1,0,9,1>,3,1,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
            ((Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false> *)&Cols_jac2,
             (Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 3;
  Cols_jac3.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[3] =
       0.0;
  Cols_jac3.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[5] =
       4.44659081257122e-323;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R_jac2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac2;
  Cols_jac3.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[0] =
       (double)&Cols_jac2;
  Cols_jac3.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[2] =
       (double)&Cols_jac2;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,1,0,9,1>,3,1,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
            ((Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false> *)&Cols_jac3,
             (Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       3;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 1;
  Cols_jac3.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[0] =
       (double)(Cols_jac2.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                m_data.array + 3);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 3;
  Cols_jac3.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[3] =
       1.48219693752374e-323;
  Cols_jac3.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[5] =
       4.44659081257122e-323;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac2;
  Cols_jac3.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[2] =
       (double)&Cols_jac2;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,1,0,9,1>,3,1,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
            ((Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false> *)&Cols_jac3,
             (Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       6;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  Cols_jac3.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[0] =
       (double)(Cols_jac2.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                m_data.array + 6);
  Cols_jac3.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[2] =
       (double)&Cols_jac2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 3;
  Cols_jac3.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[3] =
       2.96439387504748e-323;
  Cols_jac3.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[5] =
       4.44659081257122e-323;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac2;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,1,0,9,1>,3,1,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
            ((Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false> *)&Cols_jac3,
             (Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false,_true>.m_startRow.m_value
       = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false,_true>.m_outerStride = 9;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R_jac3;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false>,_0>.m_data =
       (PointerType)&Cols_jac3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false,_true>.m_xpr = &Cols_jac3;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,1,0,9,1>,3,1,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
            (&local_60,(Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       3;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 1;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false>,_0>.m_data =
       Cols_jac3.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       + 3;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false,_true>.m_startRow.m_value
       = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false,_true>.m_outerStride = 9;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false,_true>.m_xpr = &Cols_jac3;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,1,0,9,1>,3,1,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
            (&local_60,(Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       6;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 2;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false>,_0>.m_data =
       Cols_jac3.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       + 6;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false,_true>.m_startRow.m_value
       = 6;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false,_true>.m_outerStride = 9;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false,_true>.m_xpr = &Cols_jac3;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,9,1,0,9,1>,3,1,false>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
            (&local_60,(Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)&local_420);
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2
  ;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = y1P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  pdStack_3e8 = (double *)&Cols;
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  pdStack_3e8 = (double *)&Rows;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = y2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  SVar13 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = z1P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  pdStack_3c8 = (double *)&Cols;
  SVar14 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3e8 = (double *)0x0;
  pdStack_3c8 = (double *)&Rows;
  local_3e0 = (double *)0x1;
  local_3d0 = z2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  SVar15 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  pdVar1 = R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac1;
  (local_398->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xc] = SVar15 + SVar14 + SVar13 + SVar12;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  pdStack_3e8 = (double *)&Cols;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = y1P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar1;
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = SVar12;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  pdStack_3e8 = (double *)&Cols_jac1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = y1P;
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  pdStack_3e8 = (double *)&Rows;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = SVar12 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xc];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = y2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac1;
  SVar13 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = SVar13 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xc];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  pdStack_3e8 = (double *)&Rows_jac1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = y2P;
  SVar13 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  pdVar1 = R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 1;
  pdStack_3c8 = (double *)&Cols;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = SVar13 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xc];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = z1P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac1;
  SVar14 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)(R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = SVar14 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xc];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3e8 = (double *)0x0;
  pdStack_3c8 = (double *)&Cols_jac1;
  local_3e0 = (double *)0x1;
  local_3d0 = z1P;
  SVar14 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac1;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = SVar14 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xc];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3e8 = (double *)0x0;
  pdStack_3c8 = (double *)&Rows;
  local_3e0 = (double *)0x1;
  local_3d0 = z2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)pdVar1;
  SVar15 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)(R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = SVar15 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xc];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3e8 = (double *)0x0;
  pdStack_3c8 = (double *)&Rows_jac1;
  local_3e0 = (double *)0x1;
  local_3d0 = z2P;
  SVar15 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       2;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = SVar15 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xc];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  pdStack_3e8 = (double *)&Cols;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = y1P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac2;
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = SVar12;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  pdStack_3e8 = (double *)&Cols_jac2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = y1P;
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       2;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = SVar12 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xc];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  pdStack_3e8 = (double *)&Rows;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = y2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac2;
  SVar13 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = SVar13 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xc];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  pdStack_3e8 = (double *)&Rows_jac2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = y2P;
  SVar13 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)(R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 1);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac2;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = SVar13 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xc];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3e8 = (double *)0x0;
  pdStack_3c8 = (double *)&Cols;
  local_3e0 = (double *)0x1;
  local_3d0 = z1P;
  SVar14 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = SVar14 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xc];
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3e8 = (double *)0x0;
  pdStack_3c8 = (double *)&Cols_jac2;
  local_3e0 = (double *)0x1;
  local_3d0 = z1P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)pdVar1;
  SVar14 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)(R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 1);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac2;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = SVar14 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xc];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3e8 = (double *)0x0;
  pdStack_3c8 = (double *)&Rows;
  local_3e0 = (double *)0x1;
  local_3d0 = z2P;
  SVar15 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = SVar15 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xc];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3e8 = (double *)0x0;
  pdStack_3c8 = (double *)&Rows_jac2;
  local_3e0 = (double *)0x1;
  local_3d0 = z2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)pdVar1;
  SVar15 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       2;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = SVar15 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xc];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  pdStack_3e8 = (double *)&Cols;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = y1P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac3;
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = SVar12;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  pdStack_3e8 = (double *)&Cols_jac3;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = y1P;
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       2;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = SVar12 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xc];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  pdStack_3e8 = (double *)&Rows;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = y2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac3;
  SVar13 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = SVar13 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xc];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  pdStack_3e8 = (double *)&Rows_jac3;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = y2P;
  SVar13 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  pdVar1 = R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac3;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = SVar13 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xc];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3e8 = (double *)0x0;
  pdStack_3c8 = (double *)&Cols;
  local_3e0 = (double *)0x1;
  local_3d0 = z1P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)pdVar1;
  SVar14 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = SVar14 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xc];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)(R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1);
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3e8 = (double *)0x0;
  pdStack_3c8 = (double *)&Cols_jac3;
  local_3e0 = (double *)0x1;
  local_3d0 = z1P;
  SVar14 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac3;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = SVar14 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xc];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = z2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)pdVar1;
  pdStack_3c8 = (double *)&Rows;
  SVar15 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)(R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = SVar15 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xc];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  pdStack_3c8 = (double *)&Rows_jac3;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = z2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  SVar15 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = SVar15 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xc];
  pdStack_3e8 = (double *)&Cols;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = z1P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = z2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  pdStack_3e8 = (double *)&Rows;
  SVar13 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2
  ;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  pdStack_3c8 = (double *)&Cols;
  local_3e0 = (double *)0x1;
  local_3d0 = x1P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  SVar14 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = x2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  pdStack_3c8 = (double *)&Rows;
  SVar15 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R_jac1;
  pdStack_3e8 = (double *)&Cols;
  (local_398->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xd] = SVar15 + SVar14 + SVar13 + SVar12;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = z1P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)
       local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data;
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  pdStack_3e8 = (double *)&Cols_jac1;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = SVar12;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = z1P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R_jac1;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = SVar12 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xd];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = z2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)
       local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data;
  pdStack_3e8 = (double *)&Rows;
  SVar13 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  pdStack_3e8 = (double *)&Rows_jac1;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = SVar13 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xd];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = z2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  SVar13 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)(R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 2);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = SVar13 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xd];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  pdStack_3c8 = (double *)&Cols;
  local_3e0 = (double *)0x1;
  local_3d0 = x1P;
  SVar14 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)(R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2);
  pdStack_3c8 = (double *)&Cols_jac1;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = SVar14 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xd];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = x1P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  SVar14 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)(R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 2);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac1;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = SVar14 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xd];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  pdStack_3c8 = (double *)&Rows;
  local_3e0 = (double *)0x1;
  local_3d0 = x2P;
  SVar15 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)(R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = SVar15 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xd];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  pdStack_3c8 = (double *)&Rows_jac1;
  local_3e0 = (double *)0x1;
  local_3d0 = x2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  SVar15 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R_jac2;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = SVar15 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xd];
  pdStack_3e8 = (double *)&Cols;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = z1P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)
       local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data;
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  pdStack_3e8 = (double *)&Cols_jac2;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = SVar12;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = z1P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R_jac2;
  pdStack_3e8 = (double *)&Rows;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = SVar12 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xd];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = z2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)
       local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data;
  SVar13 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  pdStack_3e8 = (double *)&Rows_jac2;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = SVar13 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xd];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = z2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  SVar13 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)(R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 2);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = SVar13 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xd];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac2;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  pdStack_3c8 = (double *)&Cols;
  local_3e0 = (double *)0x1;
  local_3d0 = x1P;
  SVar14 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)(R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = SVar14 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xd];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  pdStack_3c8 = (double *)&Cols_jac2;
  local_3e0 = (double *)0x1;
  local_3d0 = x1P;
  SVar14 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)(R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 2);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac2;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = SVar14 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xd];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  pdStack_3c8 = (double *)&Rows;
  local_3e0 = (double *)0x1;
  local_3d0 = x2P;
  SVar15 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)(R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = SVar15 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xd];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  pdStack_3c8 = (double *)&Rows_jac2;
  local_3e0 = (double *)0x1;
  local_3d0 = x2P;
  SVar15 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = SVar15 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xd];
  pdStack_3e8 = (double *)&Cols;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = z1P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R_jac3;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac3;
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  pdStack_3e8 = (double *)&Cols_jac3;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = SVar12;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = z1P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  pdStack_3e8 = (double *)&Rows;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = SVar12 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xd];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = z2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R_jac3;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac3;
  SVar13 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  pdStack_3e8 = (double *)&Rows_jac3;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = SVar13 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xd];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = z2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       (PointerType)&R;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  SVar13 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)(R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 2);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = SVar13 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xd];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac3;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  pdStack_3c8 = (double *)&Cols;
  local_3e0 = (double *)0x1;
  local_3d0 = x1P;
  SVar14 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)(R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = SVar14 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xd];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  pdStack_3c8 = (double *)&Cols_jac3;
  local_3e0 = (double *)0x1;
  local_3d0 = x1P;
  SVar14 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)(R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 2);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac3;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = SVar14 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xd];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  pdStack_3c8 = (double *)&Rows;
  local_3e0 = (double *)0x1;
  local_3d0 = x2P;
  SVar15 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)(R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = SVar15 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xd];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  pdStack_3c8 = (double *)&Rows_jac3;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x2;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = x2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  SVar15 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = SVar15 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xd];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = x1P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  pdStack_3e8 = (double *)&Cols;
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = x2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  pdStack_3e8 = (double *)&Rows;
  SVar13 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = y1P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  pdStack_3c8 = (double *)&Cols;
  SVar14 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = y2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  pdStack_3c8 = (double *)&Rows;
  SVar15 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = x1P;
  (local_398->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xe] = SVar15 + SVar14 + SVar13 + SVar12;
  pdStack_3e8 = (double *)&Cols;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac1;
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = SVar12;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  pdStack_3e8 = (double *)&Cols_jac1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = x1P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       1;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = SVar12 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xe];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  pdStack_3e8 = (double *)&Rows;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = x2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac1;
  SVar13 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = SVar13 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xe];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  pdStack_3e8 = (double *)&Rows_jac1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = x2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  SVar13 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  pdStack_3c8 = (double *)&Cols;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = SVar13 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xe];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = y1P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R_jac1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac1;
  SVar14 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = SVar14 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xe];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  pdStack_3c8 = (double *)&Cols_jac1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = y1P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.
       m_value;
  SVar14 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R_jac1;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = SVar14 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xe];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  pdStack_3c8 = (double *)&Rows;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = y2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.
       m_value;
  SVar15 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = SVar15 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xe];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  pdStack_3c8 = (double *)&Rows_jac1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = y2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.
       m_value;
  SVar15 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       1;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = SVar15 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xe];
  pdStack_3e8 = (double *)&Cols;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = x1P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac2;
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = SVar12;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  pdStack_3e8 = (double *)&Cols_jac2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = x1P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar1;
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       1;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = SVar12 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xe];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  pdStack_3e8 = (double *)&Rows;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = x2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac2;
  SVar13 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  pdStack_3e8 = (double *)&Rows_jac2;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = SVar13 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xe];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = x2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  SVar13 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R_jac2;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = SVar13 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xe];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  pdStack_3c8 = (double *)&Cols;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = y1P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.
       m_value;
  SVar14 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  pdStack_3c8 = (double *)&Cols_jac2;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = SVar14 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xe];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = y1P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  SVar14 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R_jac2;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = SVar14 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xe];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  pdStack_3c8 = (double *)&Rows;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = y2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.
       m_value;
  SVar15 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  pdStack_3c8 = (double *)&Rows_jac2;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = SVar15 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xe];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = y2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R;
  SVar15 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  pdVar1 = R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 1;
  pdStack_3e8 = (double *)&Cols;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = SVar15 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xe];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = x1P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac3;
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = SVar12;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  pdStack_3e8 = (double *)&Cols_jac3;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = x1P;
  SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  pdStack_3e8 = (double *)&Rows;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = SVar12 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xe];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = x2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data = pdVar1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R_jac3;
  SVar13 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
       R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &R;
  pdStack_3e8 = (double *)&Rows_jac3;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = SVar13 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xe];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = 1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.m_value
       = 0;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride = 1;
  local_3f0 = x2P;
  SVar13 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  pdStack_3c8 = (double *)&Cols;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = SVar13 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xe];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = y1P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R_jac3;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac3;
  SVar14 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = SVar14 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xe];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  pdStack_3c8 = (double *)&Cols_jac3;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = y1P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.
       m_value;
  SVar14 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  pdStack_3c8 = (double *)&Rows;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = SVar14 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xe];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = y2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R_jac3;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)&R_jac3;
  SVar15 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&R;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = SVar15 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xe];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  pdStack_3c8 = (double *)&Rows_jac3;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)0x0;
  pdStack_3e8 = (double *)0x0;
  local_3e0 = (double *)0x1;
  local_3d0 = y2P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.
       m_value;
  SVar15 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = SVar15 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xe];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)m11P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&Cols;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)&Cols;
  SVar16 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xbff0000000000000;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)m22P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&Rows;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)&Rows;
  SVar17 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)m12P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&Rows;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)&Cols;
  SVar18 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)&Cols_jac1;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)m11P;
  (local_398->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xf] = SVar18 + SVar17 + SVar16;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&Cols;
  SVar16 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = SVar16;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)m22P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&Rows_jac1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)&Rows;
  SVar17 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = SVar17 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xf];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)m12P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&Rows_jac1;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)&Cols;
  SVar18 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)&Cols_jac1;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = SVar18 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xf];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)m12P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&Rows;
  SVar18 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = SVar18 + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xf];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)&Cols_jac2;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)m11P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&Cols;
  SVar16 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = SVar16;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)m22P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&Rows_jac2;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)&Rows;
  SVar17 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = SVar17 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xf];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)m12P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&Rows_jac2;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)&Cols;
  SVar18 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)&Cols_jac2;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = SVar18 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xf];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)m12P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&Rows;
  SVar18 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = SVar18 + (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xf];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)m11P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&Cols;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)&Cols_jac3;
  SVar16 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = SVar16;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)m22P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&Rows_jac3;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)&Rows;
  SVar17 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)&Cols;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = SVar17 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xf];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)m12P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&Rows_jac3;
  SVar18 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = SVar18 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xf];
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr =
       (XprTypeNested)0xc000000000000000;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride =
       (Index)m12P;
  local_420.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.m_value
       = (long)&Rows;
  local_3f0 = (Matrix<double,_3,_9,_0,_3,_9> *)&Cols_jac3;
  SVar18 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)&local_420);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = SVar18 + (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                  m_data.array[0xf];
  dVar3 = (local_398->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
          .array[0xd];
  (local_398->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [3] = (local_398->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
        array[0xc];
  (local_398->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [7] = dVar3;
  (local_398->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xb] = (local_398->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
          .array[0xe];
  dVar3 = (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0xd];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[3] =
       (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [0xc];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[7] =
       dVar3;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xb]
       = (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  dVar3 = (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0xd];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[3] =
       (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [0xc];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[7] =
       dVar3;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xb]
       = (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  dVar3 = (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0xd];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[3] =
       (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [0xc];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[7] =
       dVar3;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xb]
       = (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  return local_398;
}

Assistant:

Eigen::Matrix4d
opengv::relative_pose::modules::ge::composeGwithJacobians(
    const Eigen::Matrix3d & xxF,
    const Eigen::Matrix3d & yyF,
    const Eigen::Matrix3d & zzF,
    const Eigen::Matrix3d & xyF,
    const Eigen::Matrix3d & yzF,
    const Eigen::Matrix3d & zxF,
    const Eigen::Matrix<double,3,9> & x1P,
    const Eigen::Matrix<double,3,9> & y1P,
    const Eigen::Matrix<double,3,9> & z1P,
    const Eigen::Matrix<double,3,9> & x2P,
    const Eigen::Matrix<double,3,9> & y2P,
    const Eigen::Matrix<double,3,9> & z2P,
    const Eigen::Matrix<double,9,9> & m11P,
    const Eigen::Matrix<double,9,9> & m12P,
    const Eigen::Matrix<double,9,9> & m22P,
    const cayley_t & cayley,
    Eigen::Matrix4d & G_jac1,
    Eigen::Matrix4d & G_jac2,
    Eigen::Matrix4d & G_jac3 )
{
  rotation_t R = math::cayley2rot_reduced(cayley);
  rotation_t R_jac1;
  rotation_t R_jac2;
  rotation_t R_jac3;

  R_jac1(0,0) =  2.0*cayley[0];
  R_jac1(0,1) =  2.0*cayley[1];
  R_jac1(0,2) =  2.0*cayley[2];
  R_jac1(1,0) =  2.0*cayley[1];
  R_jac1(1,1) = -2.0*cayley[0];
  R_jac1(1,2) = -2.0;
  R_jac1(2,0) =  2.0*cayley[2];
  R_jac1(2,1) =  2.0;
  R_jac1(2,2) = -2.0*cayley[0];
  R_jac2(0,0) = -2.0*cayley[1];
  R_jac2(0,1) =  2.0*cayley[0];
  R_jac2(0,2) =  2.0;
  R_jac2(1,0) =  2.0*cayley[0];
  R_jac2(1,1) =  2.0*cayley[1];
  R_jac2(1,2) =  2.0*cayley[2];
  R_jac2(2,0) = -2.0;
  R_jac2(2,1) =  2.0*cayley[2];
  R_jac2(2,2) = -2.0*cayley[1];
  R_jac3(0,0) = -2.0*cayley[2];
  R_jac3(0,1) = -2.0;
  R_jac3(0,2) =  2.0*cayley[0];
  R_jac3(1,0) =  2.0;
  R_jac3(1,1) = -2.0*cayley[2];
  R_jac3(1,2) =  2.0*cayley[1];
  R_jac3(2,0) =  2.0*cayley[0];
  R_jac3(2,1) =  2.0*cayley[1];
  R_jac3(2,2) =  2.0*cayley[2];

  //Fill the matrix G using the precomputed summation terms. Plus Jacobian.
  Eigen::Matrix4d G;
  double temp;
  temp =      R.row(2)*yyF*R.row(2).transpose();
  G(0,0)  = temp;
  temp = -2.0*R.row(2)*yzF*R.row(1).transpose();
  G(0,0) += temp;
  temp =      R.row(1)*zzF*R.row(1).transpose();
  G(0,0) += temp;
  temp = 2.0*R_jac1.row(2)*yyF*R.row(2).transpose();
  G_jac1(0,0)  = temp;
  temp = -2.0*R_jac1.row(2)*yzF*R.row(1).transpose();
  G_jac1(0,0) += temp;
  temp = -2.0*R.row(2)*yzF*R_jac1.row(1).transpose();
  G_jac1(0,0) += temp;
  temp = 2.0*R_jac1.row(1)*zzF*R.row(1).transpose();
  G_jac1(0,0) += temp;
  temp = 2.0*R_jac2.row(2)*yyF*R.row(2).transpose();
  G_jac2(0,0)  = temp;
  temp = -2.0*R_jac2.row(2)*yzF*R.row(1).transpose();
  G_jac2(0,0) += temp;
  temp = -2.0*R.row(2)*yzF*R_jac2.row(1).transpose();
  G_jac2(0,0) += temp;
  temp = 2.0*R_jac2.row(1)*zzF*R.row(1).transpose();
  G_jac2(0,0) += temp;
  temp = 2.0*R_jac3.row(2)*yyF*R.row(2).transpose();
  G_jac3(0,0)  = temp;
  temp = -2.0*R_jac3.row(2)*yzF*R.row(1).transpose();
  G_jac3(0,0) += temp;
  temp = -2.0*R.row(2)*yzF*R_jac3.row(1).transpose();
  G_jac3(0,0) += temp;
  temp = 2.0*R_jac3.row(1)*zzF*R.row(1).transpose();
  G_jac3(0,0) += temp;

  temp =      R.row(2)*yzF*R.row(0).transpose();
  G(0,1)  = temp;
  temp = -1.0*R.row(2)*xyF*R.row(2).transpose();
  G(0,1) += temp;
  temp = -1.0*R.row(1)*zzF*R.row(0).transpose();
  G(0,1) += temp;
  temp =      R.row(1)*zxF*R.row(2).transpose();
  G(0,1) += temp;
  temp = R_jac1.row(2)*yzF*R.row(0).transpose();
  G_jac1(0,1)  = temp;
  temp = R.row(2)*yzF*R_jac1.row(0).transpose();
  G_jac1(0,1) += temp;
  temp = -2.0*R_jac1.row(2)*xyF*R.row(2).transpose();
  G_jac1(0,1) += temp;
  temp = -R_jac1.row(1)*zzF*R.row(0).transpose();
  G_jac1(0,1) += temp;
  temp = -R.row(1)*zzF*R_jac1.row(0).transpose();
  G_jac1(0,1) += temp;
  temp = R_jac1.row(1)*zxF*R.row(2).transpose();
  G_jac1(0,1) += temp;
  temp = R.row(1)*zxF*R_jac1.row(2).transpose();
  G_jac1(0,1) += temp;
  temp = R_jac2.row(2)*yzF*R.row(0).transpose();
  G_jac2(0,1)  = temp;
  temp = R.row(2)*yzF*R_jac2.row(0).transpose();
  G_jac2(0,1) += temp;
  temp = -2.0*R_jac2.row(2)*xyF*R.row(2).transpose();
  G_jac2(0,1) += temp;
  temp = -R_jac2.row(1)*zzF*R.row(0).transpose();
  G_jac2(0,1) += temp;
  temp = -R.row(1)*zzF*R_jac2.row(0).transpose();
  G_jac2(0,1) += temp;
  temp = R_jac2.row(1)*zxF*R.row(2).transpose();
  G_jac2(0,1) += temp;
  temp = R.row(1)*zxF*R_jac2.row(2).transpose();
  G_jac2(0,1) += temp;
  temp = R_jac3.row(2)*yzF*R.row(0).transpose();
  G_jac3(0,1)  = temp;
  temp = R.row(2)*yzF*R_jac3.row(0).transpose();
  G_jac3(0,1) += temp;
  temp = -2.0*R_jac3.row(2)*xyF*R.row(2).transpose();
  G_jac3(0,1) += temp;
  temp = -R_jac3.row(1)*zzF*R.row(0).transpose();
  G_jac3(0,1) += temp;
  temp = -R.row(1)*zzF*R_jac3.row(0).transpose();
  G_jac3(0,1) += temp;
  temp = R_jac3.row(1)*zxF*R.row(2).transpose();
  G_jac3(0,1) += temp;
  temp = R.row(1)*zxF*R_jac3.row(2).transpose();
  G_jac3(0,1) += temp;

  temp =      R.row(2)*xyF*R.row(1).transpose();
  G(0,2)  = temp;
  temp = -1.0*R.row(2)*yyF*R.row(0).transpose();
  G(0,2) += temp;
  temp = -1.0*R.row(1)*zxF*R.row(1).transpose();
  G(0,2) += temp;
  temp =      R.row(1)*yzF*R.row(0).transpose();
  G(0,2) += temp;
  temp = R_jac1.row(2)*xyF*R.row(1).transpose();
  G_jac1(0,2)  = temp;
  temp = R.row(2)*xyF*R_jac1.row(1).transpose();
  G_jac1(0,2) += temp;
  temp = -R_jac1.row(2)*yyF*R.row(0).transpose();
  G_jac1(0,2) += temp;
  temp = -R.row(2)*yyF*R_jac1.row(0).transpose();
  G_jac1(0,2) += temp;
  temp = -2.0*R_jac1.row(1)*zxF*R.row(1).transpose();
  G_jac1(0,2) += temp;
  temp = R_jac1.row(1)*yzF*R.row(0).transpose();
  G_jac1(0,2) += temp;
  temp = R.row(1)*yzF*R_jac1.row(0).transpose();
  G_jac1(0,2) += temp;
  temp = R_jac2.row(2)*xyF*R.row(1).transpose();
  G_jac2(0,2)  = temp;
  temp = R.row(2)*xyF*R_jac2.row(1).transpose();
  G_jac2(0,2) += temp;
  temp = -R_jac2.row(2)*yyF*R.row(0).transpose();
  G_jac2(0,2) += temp;
  temp = -R.row(2)*yyF*R_jac2.row(0).transpose();
  G_jac2(0,2) += temp;
  temp = -2.0*R_jac2.row(1)*zxF*R.row(1).transpose();
  G_jac2(0,2) += temp;
  temp = R_jac2.row(1)*yzF*R.row(0).transpose();
  G_jac2(0,2) += temp;
  temp = R.row(1)*yzF*R_jac2.row(0).transpose();
  G_jac2(0,2) += temp;
  temp = R_jac3.row(2)*xyF*R.row(1).transpose();
  G_jac3(0,2)  = temp;
  temp = R.row(2)*xyF*R_jac3.row(1).transpose();
  G_jac3(0,2) += temp;
  temp = -R_jac3.row(2)*yyF*R.row(0).transpose();
  G_jac3(0,2) += temp;
  temp = -R.row(2)*yyF*R_jac3.row(0).transpose();
  G_jac3(0,2) += temp;
  temp = -2.0*R_jac3.row(1)*zxF*R.row(1).transpose();
  G_jac3(0,2) += temp;
  temp = R_jac3.row(1)*yzF*R.row(0).transpose();
  G_jac3(0,2) += temp;
  temp = R.row(1)*yzF*R_jac3.row(0).transpose();
  G_jac3(0,2) += temp;

  temp =      R.row(0)*zzF*R.row(0).transpose();
  G(1,1)  = temp;
  temp = -2.0*R.row(0)*zxF*R.row(2).transpose();
  G(1,1) += temp;
  temp =      R.row(2)*xxF*R.row(2).transpose();
  G(1,1) += temp;
  temp = 2.0*R_jac1.row(0)*zzF*R.row(0).transpose();
  G_jac1(1,1)  = temp;
  temp = -2.0*R_jac1.row(0)*zxF*R.row(2).transpose();
  G_jac1(1,1) += temp;
  temp = -2.0*R.row(0)*zxF*R_jac1.row(2).transpose();
  G_jac1(1,1) += temp;
  temp = 2.0*R_jac1.row(2)*xxF*R.row(2).transpose();
  G_jac1(1,1) += temp;
  temp = 2.0*R_jac2.row(0)*zzF*R.row(0).transpose();
  G_jac2(1,1)  = temp;
  temp = -2.0*R_jac2.row(0)*zxF*R.row(2).transpose();
  G_jac2(1,1) += temp;
  temp = -2.0*R.row(0)*zxF*R_jac2.row(2).transpose();
  G_jac2(1,1) += temp;
  temp = 2.0*R_jac2.row(2)*xxF*R.row(2).transpose();
  G_jac2(1,1) += temp;
  temp = 2.0*R_jac3.row(0)*zzF*R.row(0).transpose();
  G_jac3(1,1)  = temp;
  temp = -2.0*R_jac3.row(0)*zxF*R.row(2).transpose();
  G_jac3(1,1) += temp;
  temp = -2.0*R.row(0)*zxF*R_jac3.row(2).transpose();
  G_jac3(1,1) += temp;
  temp = 2.0*R_jac3.row(2)*xxF*R.row(2).transpose();
  G_jac3(1,1) += temp;

  temp =      R.row(0)*zxF*R.row(1).transpose();
  G(1,2)  = temp;
  temp = -1.0*R.row(0)*yzF*R.row(0).transpose();
  G(1,2) += temp;
  temp = -1.0*R.row(2)*xxF*R.row(1).transpose();
  G(1,2) += temp;
  temp =      R.row(2)*xyF*R.row(0).transpose();
  G(1,2) += temp;
  temp = R_jac1.row(0)*zxF*R.row(1).transpose();
  G_jac1(1,2)  = temp;
  temp = R.row(0)*zxF*R_jac1.row(1).transpose();
  G_jac1(1,2) += temp;
  temp = -2.0*R_jac1.row(0)*yzF*R.row(0).transpose();
  G_jac1(1,2) += temp;
  temp = -R_jac1.row(2)*xxF*R.row(1).transpose();
  G_jac1(1,2) += temp;
  temp = -R.row(2)*xxF*R_jac1.row(1).transpose();
  G_jac1(1,2) += temp;
  temp = R_jac1.row(2)*xyF*R.row(0).transpose();
  G_jac1(1,2) += temp;
  temp = R.row(2)*xyF*R_jac1.row(0).transpose();
  G_jac1(1,2) += temp;
  temp = R_jac2.row(0)*zxF*R.row(1).transpose();
  G_jac2(1,2)  = temp;
  temp = R.row(0)*zxF*R_jac2.row(1).transpose();
  G_jac2(1,2) += temp;
  temp = -2.0*R_jac2.row(0)*yzF*R.row(0).transpose();
  G_jac2(1,2) += temp;
  temp = -R_jac2.row(2)*xxF*R.row(1).transpose();
  G_jac2(1,2) += temp;
  temp = -R.row(2)*xxF*R_jac2.row(1).transpose();
  G_jac2(1,2) += temp;
  temp = R_jac2.row(2)*xyF*R.row(0).transpose();
  G_jac2(1,2) += temp;
  temp = R.row(2)*xyF*R_jac2.row(0).transpose();
  G_jac2(1,2) += temp;
  temp = R_jac3.row(0)*zxF*R.row(1).transpose();
  G_jac3(1,2)  = temp;
  temp = R.row(0)*zxF*R_jac3.row(1).transpose();
  G_jac3(1,2) += temp;
  temp = -2.0*R_jac3.row(0)*yzF*R.row(0).transpose();
  G_jac3(1,2) += temp;
  temp = -R_jac3.row(2)*xxF*R.row(1).transpose();
  G_jac3(1,2) += temp;
  temp = -R.row(2)*xxF*R_jac3.row(1).transpose();
  G_jac3(1,2) += temp;
  temp = R_jac3.row(2)*xyF*R.row(0).transpose();
  G_jac3(1,2) += temp;
  temp = R.row(2)*xyF*R_jac3.row(0).transpose();
  G_jac3(1,2) += temp;

  temp =      R.row(1)*xxF*R.row(1).transpose();
  G(2,2)  = temp;
  temp = -2.0*R.row(0)*xyF*R.row(1).transpose();
  G(2,2) += temp;
  temp =      R.row(0)*yyF*R.row(0).transpose();
  G(2,2) += temp;
  temp = 2.0*R_jac1.row(1)*xxF*R.row(1).transpose();
  G_jac1(2,2)  = temp;
  temp = -2.0*R_jac1.row(0)*xyF*R.row(1).transpose();
  G_jac1(2,2) += temp;
  temp = -2.0*R.row(0)*xyF*R_jac1.row(1).transpose();
  G_jac1(2,2) += temp;
  temp = 2.0*R_jac1.row(0)*yyF*R.row(0).transpose();
  G_jac1(2,2) += temp;
  temp = 2.0*R_jac2.row(1)*xxF*R.row(1).transpose();
  G_jac2(2,2)  = temp;
  temp = -2.0*R_jac2.row(0)*xyF*R.row(1).transpose();
  G_jac2(2,2) += temp;
  temp = -2.0*R.row(0)*xyF*R_jac2.row(1).transpose();
  G_jac2(2,2) += temp;
  temp = 2.0*R_jac2.row(0)*yyF*R.row(0).transpose();
  G_jac2(2,2) += temp;
  temp = 2.0*R_jac3.row(1)*xxF*R.row(1).transpose();
  G_jac3(2,2)  = temp;
  temp = -2.0*R_jac3.row(0)*xyF*R.row(1).transpose();
  G_jac3(2,2) += temp;
  temp = -2.0*R.row(0)*xyF*R_jac3.row(1).transpose();
  G_jac3(2,2) += temp;
  temp = 2.0*R_jac3.row(0)*yyF*R.row(0).transpose();
  G_jac3(2,2) += temp;

  G(1,0) = G(0,1);
  G(2,0) = G(0,2);
  G(2,1) = G(1,2);
  G_jac1(1,0) = G_jac1(0,1);
  G_jac1(2,0) = G_jac1(0,2);
  G_jac1(2,1) = G_jac1(1,2);
  G_jac2(1,0) = G_jac2(0,1);
  G_jac2(2,0) = G_jac2(0,2);
  G_jac2(2,1) = G_jac2(1,2);
  G_jac3(1,0) = G_jac3(0,1);
  G_jac3(2,0) = G_jac3(0,2);
  G_jac3(2,1) = G_jac3(1,2);

  //the generalized terms:
  Eigen::Matrix<double,1,9> Rows;
  Rows.block<1,3>(0,0) = R.row(0);
  Rows.block<1,3>(0,3) = R.row(1);
  Rows.block<1,3>(0,6) = R.row(2);
  
  Eigen::Matrix<double,9,1> Cols;
  Cols.block<3,1>(0,0) = R.col(0);
  Cols.block<3,1>(3,0) = R.col(1);
  Cols.block<3,1>(6,0) = R.col(2);
  
  Eigen::Matrix<double,1,9> Rows_jac1;
  Rows_jac1.block<1,3>(0,0) = R_jac1.row(0);
  Rows_jac1.block<1,3>(0,3) = R_jac1.row(1);
  Rows_jac1.block<1,3>(0,6) = R_jac1.row(2);
  Eigen::Matrix<double,1,9> Rows_jac2;
  Rows_jac2.block<1,3>(0,0) = R_jac2.row(0);
  Rows_jac2.block<1,3>(0,3) = R_jac2.row(1);
  Rows_jac2.block<1,3>(0,6) = R_jac2.row(2);
  Eigen::Matrix<double,1,9> Rows_jac3;
  Rows_jac3.block<1,3>(0,0) = R_jac3.row(0);
  Rows_jac3.block<1,3>(0,3) = R_jac3.row(1);
  Rows_jac3.block<1,3>(0,6) = R_jac3.row(2);
  
  Eigen::Matrix<double,9,1> Cols_jac1;
  Cols_jac1.block<3,1>(0,0) = R_jac1.col(0);
  Cols_jac1.block<3,1>(3,0) = R_jac1.col(1);
  Cols_jac1.block<3,1>(6,0) = R_jac1.col(2);
  Eigen::Matrix<double,9,1> Cols_jac2;
  Cols_jac2.block<3,1>(0,0) = R_jac2.col(0);
  Cols_jac2.block<3,1>(3,0) = R_jac2.col(1);
  Cols_jac2.block<3,1>(6,0) = R_jac2.col(2);
  Eigen::Matrix<double,9,1> Cols_jac3;
  Cols_jac3.block<3,1>(0,0) = R_jac3.col(0);
  Cols_jac3.block<3,1>(3,0) = R_jac3.col(1);
  Cols_jac3.block<3,1>(6,0) = R_jac3.col(2);
  
  temp =      R.row(2)*y1P*Cols;
  G(0,3)  = temp;
  temp =      R.row(2)*y2P*Rows.transpose();
  G(0,3) += temp;
  temp = -1.0*R.row(1)*z1P*Cols;
  G(0,3) += temp;
  temp = -1.0*R.row(1)*z2P*Rows.transpose();
  G(0,3) += temp;
  temp =      R_jac1.row(2)*y1P*Cols;
  G_jac1(0,3)  = temp;
  temp =      R.row(2)*y1P*Cols_jac1;
  G_jac1(0,3) += temp;
  temp =      R_jac1.row(2)*y2P*Rows.transpose();
  G_jac1(0,3) += temp;
  temp =      R.row(2)*y2P*Rows_jac1.transpose();
  G_jac1(0,3) += temp;
  temp = -1.0*R_jac1.row(1)*z1P*Cols;
  G_jac1(0,3) += temp;
  temp = -1.0*R.row(1)*z1P*Cols_jac1;
  G_jac1(0,3) += temp;
  temp = -1.0*R_jac1.row(1)*z2P*Rows.transpose();
  G_jac1(0,3) += temp;
  temp = -1.0*R.row(1)*z2P*Rows_jac1.transpose();
  G_jac1(0,3) += temp;
  temp =      R_jac2.row(2)*y1P*Cols;
  G_jac2(0,3)  = temp;
  temp =      R.row(2)*y1P*Cols_jac2;
  G_jac2(0,3) += temp;
  temp =      R_jac2.row(2)*y2P*Rows.transpose();
  G_jac2(0,3) += temp;
  temp =      R.row(2)*y2P*Rows_jac2.transpose();
  G_jac2(0,3) += temp;
  temp = -1.0*R_jac2.row(1)*z1P*Cols;
  G_jac2(0,3) += temp;
  temp = -1.0*R.row(1)*z1P*Cols_jac2;
  G_jac2(0,3) += temp;
  temp = -1.0*R_jac2.row(1)*z2P*Rows.transpose();
  G_jac2(0,3) += temp;
  temp = -1.0*R.row(1)*z2P*Rows_jac2.transpose();
  G_jac2(0,3) += temp;
  temp =      R_jac3.row(2)*y1P*Cols;
  G_jac3(0,3)  = temp;
  temp =      R.row(2)*y1P*Cols_jac3;
  G_jac3(0,3) += temp;
  temp =      R_jac3.row(2)*y2P*Rows.transpose();
  G_jac3(0,3) += temp;
  temp =      R.row(2)*y2P*Rows_jac3.transpose();
  G_jac3(0,3) += temp;
  temp = -1.0*R_jac3.row(1)*z1P*Cols;
  G_jac3(0,3) += temp;
  temp = -1.0*R.row(1)*z1P*Cols_jac3;
  G_jac3(0,3) += temp;
  temp = -1.0*R_jac3.row(1)*z2P*Rows.transpose();
  G_jac3(0,3) += temp;
  temp = -1.0*R.row(1)*z2P*Rows_jac3.transpose();
  G_jac3(0,3) += temp;
  
  temp =      R.row(0)*z1P*Cols;
  G(1,3)  = temp;
  temp =      R.row(0)*z2P*Rows.transpose();
  G(1,3) += temp;
  temp = -1.0*R.row(2)*x1P*Cols;
  G(1,3) += temp;
  temp = -1.0*R.row(2)*x2P*Rows.transpose();
  G(1,3) += temp;
  temp =      R_jac1.row(0)*z1P*Cols;
  G_jac1(1,3)  = temp;
  temp =      R.row(0)*z1P*Cols_jac1;
  G_jac1(1,3) += temp;
  temp =      R_jac1.row(0)*z2P*Rows.transpose();
  G_jac1(1,3) += temp;
  temp =      R.row(0)*z2P*Rows_jac1.transpose();
  G_jac1(1,3) += temp;
  temp = -1.0*R_jac1.row(2)*x1P*Cols;
  G_jac1(1,3) += temp;
  temp = -1.0*R.row(2)*x1P*Cols_jac1;
  G_jac1(1,3) += temp;
  temp = -1.0*R_jac1.row(2)*x2P*Rows.transpose();
  G_jac1(1,3) += temp;
  temp = -1.0*R.row(2)*x2P*Rows_jac1.transpose();
  G_jac1(1,3) += temp;
  temp =      R_jac2.row(0)*z1P*Cols;
  G_jac2(1,3)  = temp;
  temp =      R.row(0)*z1P*Cols_jac2;
  G_jac2(1,3) += temp;
  temp =      R_jac2.row(0)*z2P*Rows.transpose();
  G_jac2(1,3) += temp;
  temp =      R.row(0)*z2P*Rows_jac2.transpose();
  G_jac2(1,3) += temp;
  temp = -1.0*R_jac2.row(2)*x1P*Cols;
  G_jac2(1,3) += temp;
  temp = -1.0*R.row(2)*x1P*Cols_jac2;
  G_jac2(1,3) += temp;
  temp = -1.0*R_jac2.row(2)*x2P*Rows.transpose();
  G_jac2(1,3) += temp;
  temp = -1.0*R.row(2)*x2P*Rows_jac2.transpose();
  G_jac2(1,3) += temp;
  temp =      R_jac3.row(0)*z1P*Cols;
  G_jac3(1,3)  = temp;
  temp =      R.row(0)*z1P*Cols_jac3;
  G_jac3(1,3) += temp;
  temp =      R_jac3.row(0)*z2P*Rows.transpose();
  G_jac3(1,3) += temp;
  temp =      R.row(0)*z2P*Rows_jac3.transpose();
  G_jac3(1,3) += temp;
  temp = -1.0*R_jac3.row(2)*x1P*Cols;
  G_jac3(1,3) += temp;
  temp = -1.0*R.row(2)*x1P*Cols_jac3;
  G_jac3(1,3) += temp;
  temp = -1.0*R_jac3.row(2)*x2P*Rows.transpose();
  G_jac3(1,3) += temp;
  temp = -1.0*R.row(2)*x2P*Rows_jac3.transpose();
  G_jac3(1,3) += temp;
  
  temp =      R.row(1)*x1P*Cols;
  G(2,3)  = temp;
  temp =      R.row(1)*x2P*Rows.transpose();
  G(2,3) += temp;
  temp = -1.0*R.row(0)*y1P*Cols;
  G(2,3) += temp;
  temp = -1.0*R.row(0)*y2P*Rows.transpose();
  G(2,3) += temp;
  temp =      R_jac1.row(1)*x1P*Cols;
  G_jac1(2,3)  = temp;
  temp =      R.row(1)*x1P*Cols_jac1;
  G_jac1(2,3) += temp;
  temp =      R_jac1.row(1)*x2P*Rows.transpose();
  G_jac1(2,3) += temp;
  temp =      R.row(1)*x2P*Rows_jac1.transpose();
  G_jac1(2,3) += temp;
  temp = -1.0*R_jac1.row(0)*y1P*Cols;
  G_jac1(2,3) += temp;
  temp = -1.0*R.row(0)*y1P*Cols_jac1;
  G_jac1(2,3) += temp;
  temp = -1.0*R_jac1.row(0)*y2P*Rows.transpose();
  G_jac1(2,3) += temp;
  temp = -1.0*R.row(0)*y2P*Rows_jac1.transpose();
  G_jac1(2,3) += temp;
  temp =      R_jac2.row(1)*x1P*Cols;
  G_jac2(2,3)  = temp;
  temp =      R.row(1)*x1P*Cols_jac2;
  G_jac2(2,3) += temp;
  temp =      R_jac2.row(1)*x2P*Rows.transpose();
  G_jac2(2,3) += temp;
  temp =      R.row(1)*x2P*Rows_jac2.transpose();
  G_jac2(2,3) += temp;
  temp = -1.0*R_jac2.row(0)*y1P*Cols;
  G_jac2(2,3) += temp;
  temp = -1.0*R.row(0)*y1P*Cols_jac2;
  G_jac2(2,3) += temp;
  temp = -1.0*R_jac2.row(0)*y2P*Rows.transpose();
  G_jac2(2,3) += temp;
  temp = -1.0*R.row(0)*y2P*Rows_jac2.transpose();
  G_jac2(2,3) += temp;
  temp =      R_jac3.row(1)*x1P*Cols;
  G_jac3(2,3)  = temp;
  temp =      R.row(1)*x1P*Cols_jac3;
  G_jac3(2,3) += temp;
  temp =      R_jac3.row(1)*x2P*Rows.transpose();
  G_jac3(2,3) += temp;
  temp =      R.row(1)*x2P*Rows_jac3.transpose();
  G_jac3(2,3) += temp;
  temp = -1.0*R_jac3.row(0)*y1P*Cols;
  G_jac3(2,3) += temp;
  temp = -1.0*R.row(0)*y1P*Cols_jac3;
  G_jac3(2,3) += temp;
  temp = -1.0*R_jac3.row(0)*y2P*Rows.transpose();
  G_jac3(2,3) += temp;
  temp = -1.0*R.row(0)*y2P*Rows_jac3.transpose();
  G_jac3(2,3) += temp;
  
  temp = -1.0*Cols.transpose()*m11P*Cols;
  G(3,3)  = temp;
  temp = -1.0*Rows*m22P*Rows.transpose();
  G(3,3) += temp;
  temp = -2.0*Rows*m12P*Cols;
  G(3,3) += temp;
  temp = -2.0*Cols.transpose()*m11P*Cols_jac1;
  G_jac1(3,3)  = temp;
  temp = -2.0*Rows_jac1*m22P*Rows.transpose();
  G_jac1(3,3) += temp;
  temp = -2.0*Rows_jac1*m12P*Cols;
  G_jac1(3,3) += temp;
  temp = -2.0*Rows*m12P*Cols_jac1;
  G_jac1(3,3) += temp;
  temp = -2.0*Cols.transpose()*m11P*Cols_jac2;
  G_jac2(3,3)  = temp;
  temp = -2.0*Rows_jac2*m22P*Rows.transpose();
  G_jac2(3,3) += temp;
  temp = -2.0*Rows_jac2*m12P*Cols;
  G_jac2(3,3) += temp;
  temp = -2.0*Rows*m12P*Cols_jac2;
  G_jac2(3,3) += temp;
  temp = -2.0*Cols.transpose()*m11P*Cols_jac3;
  G_jac3(3,3)  = temp;
  temp = -2.0*Rows_jac3*m22P*Rows.transpose();
  G_jac3(3,3) += temp;
  temp = -2.0*Rows_jac3*m12P*Cols;
  G_jac3(3,3) += temp;
  temp = -2.0*Rows*m12P*Cols_jac3;
  G_jac3(3,3) += temp;
  
  G(3,0) = G(0,3);
  G(3,1) = G(1,3);
  G(3,2) = G(2,3);
  G_jac1(3,0) = G_jac1(0,3);
  G_jac1(3,1) = G_jac1(1,3);
  G_jac1(3,2) = G_jac1(2,3);
  G_jac2(3,0) = G_jac2(0,3);
  G_jac2(3,1) = G_jac2(1,3);
  G_jac2(3,2) = G_jac2(2,3);
  G_jac3(3,0) = G_jac3(0,3);
  G_jac3(3,1) = G_jac3(1,3);
  G_jac3(3,2) = G_jac3(2,3);

  return G;
}